

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

OpenJTalk * openjtalk_initialize_sub(char *voice,char *dic,char *voiceDir)

{
  SpeakData *pSVar1;
  _Bool _Var2;
  int iVar3;
  OpenJTalk *oj;
  Open_JTalk *pOVar4;
  
  pSVar1 = g_psd;
  g_psd->sampling_frequency = 0;
  pSVar1->data = (short *)0x0;
  pSVar1->length = 0;
  pSVar1->onFinished = (_func_void *)0x0;
  iVar3 = Pa_Initialize();
  if (iVar3 == 0) {
    oj = (OpenJTalk *)malloc(0x680);
    if (oj != (OpenJTalk *)0x0) {
      set_current_path();
      pOVar4 = Open_JTalk_initialize();
      if (pOVar4 == (Open_JTalk *)0x0) {
        return (OpenJTalk *)0x0;
      }
      oj->open_jtalk = pOVar4;
      memset(oj->dn_dic_path_init,0,0x104);
      if (dic != (char *)0x0) {
        strcpy(oj->dn_dic_path_init,dic);
      }
      memset(oj->fn_voice_path_init,0,0x104);
      if (voice != (char *)0x0) {
        strcpy(oj->fn_voice_path_init,voice);
      }
      memset(oj->dn_voice_dir_path_init,0,0x104);
      if (voiceDir != (char *)0x0) {
        strcpy(oj->dn_voice_dir_path_init,voiceDir);
      }
      _Var2 = JTalkData_initialize(oj);
      if (!_Var2) {
        return (OpenJTalk *)0x0;
      }
      return oj;
    }
  }
  else if (g_verbose == true) {
    openjtalk_initialize_sub_cold_1();
  }
  return (OpenJTalk *)0x0;
}

Assistant:

OpenJTalk *openjtalk_initialize_sub(const char *voice, const char *dic, const char *voiceDir)
{
	g_psd->length = 0;
	g_psd->sampling_frequency = 0;
	g_psd->data = NULL;
	g_psd->onFinished = NULL;

#ifdef _DEBUG
	g_verbose = true;
#endif

#if (!defined(_WIN32) || defined(__CYGWIN__) || defined(__MINGW32__)) || defined(WINDOWS_PORTAUDIO)
	if (Pa_Initialize() != paNoError)
	{
		if (g_verbose)
		{
			console_message(u8"PortAudioの初期化に失敗しました。\n");
		}
		return NULL;
	}
#endif

	OpenJTalk *oj = (OpenJTalk *)malloc(sizeof(OpenJTalk));
	if (!oj)
	{
		return NULL;
	}

	set_current_path();

	Open_JTalk *open_jtalk = Open_JTalk_initialize();
	if (open_jtalk == NULL)
	{
		return NULL;
	}
	oj->open_jtalk = open_jtalk;

	clear_path_string(oj->dn_dic_path_init, MAX_PATH);
	if (dic != NULL)
	{
		strcpy(oj->dn_dic_path_init, dic);
	}

	clear_path_string(oj->fn_voice_path_init, MAX_PATH);
	if (voice != NULL)
	{
		strcpy(oj->fn_voice_path_init, voice);
	}

	clear_path_string(oj->dn_voice_dir_path_init, MAX_PATH);
	if (voiceDir != NULL)
	{
		strcpy(oj->dn_voice_dir_path_init, voiceDir);
	}

	if (!JTalkData_initialize(oj))
	{
		return NULL;
	}

	return oj;
}